

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlUnloadRenderBatch(RenderBatch batch)

{
  int in_stack_00000008;
  undefined4 local_c;
  int i;
  
  if (RLGL.ExtSupported.vao) {
    (*glad_glBindVertexArray)(0);
  }
  (*glad_glDisableVertexAttribArray)(0);
  (*glad_glDisableVertexAttribArray)(1);
  (*glad_glDisableVertexAttribArray)(2);
  (*glad_glDisableVertexAttribArray)(3);
  (*glad_glBindBuffer)(0x8892,0);
  (*glad_glBindBuffer)(0x8893,0);
  for (local_c = 0; local_c < in_stack_00000008; local_c = local_c + 1) {
    (*glad_glDeleteBuffers)(1,(GLuint *)(batch._0_8_ + (long)local_c * 0x48 + 0x34));
    (*glad_glDeleteBuffers)(1,(GLuint *)(batch._0_8_ + (long)local_c * 0x48 + 0x38));
    (*glad_glDeleteBuffers)(1,(GLuint *)(batch._0_8_ + (long)local_c * 0x48 + 0x3c));
    (*glad_glDeleteBuffers)(1,(GLuint *)(batch._0_8_ + (long)local_c * 0x48 + 0x40));
    if ((RLGL.ExtSupported.vao & 1U) != 0) {
      (*glad_glDeleteVertexArrays)(1,(GLuint *)(batch._0_8_ + (long)local_c * 0x48 + 0x30));
    }
    free(*(void **)(batch._0_8_ + (long)local_c * 0x48 + 0x10));
    free(*(void **)(batch._0_8_ + (long)local_c * 0x48 + 0x18));
    free(*(void **)(batch._0_8_ + (long)local_c * 0x48 + 0x20));
    free(*(void **)(batch._0_8_ + (long)local_c * 0x48 + 0x28));
  }
  free((void *)batch._0_8_);
  free(batch.vertexBuffer);
  return;
}

Assistant:

void rlUnloadRenderBatch(RenderBatch batch)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Unbind everything
    if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    glDisableVertexAttribArray(0);
    glDisableVertexAttribArray(1);
    glDisableVertexAttribArray(2);
    glDisableVertexAttribArray(3);
    glBindBuffer(GL_ARRAY_BUFFER, 0);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

    // Unload all vertex buffers data
    for (int i = 0; i < batch.buffersCount; i++)
    {
        // Delete VBOs from GPU (VRAM)
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[0]);
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[1]);
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[2]);
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[3]);

        // Delete VAOs from GPU (VRAM)
        if (RLGL.ExtSupported.vao) glDeleteVertexArrays(1, &batch.vertexBuffer[i].vaoId);

        // Free vertex arrays memory from CPU (RAM)
        RL_FREE(batch.vertexBuffer[i].vertices);
        RL_FREE(batch.vertexBuffer[i].texcoords);
        RL_FREE(batch.vertexBuffer[i].colors);
        RL_FREE(batch.vertexBuffer[i].indices);
    }

    // Unload arrays
    RL_FREE(batch.vertexBuffer);
    RL_FREE(batch.draws);
#endif
}